

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_157::TranslateToExnref::~TranslateToExnref(TranslateToExnref *this)

{
  ~TranslateToExnref(this);
  operator_delete(this,0x538);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }